

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *this;
  size_t sVar6;
  char **ppcVar7;
  undefined4 uVar8;
  char *pcVar9;
  bool bVar10;
  double dVar11;
  int vector_length;
  int output_interval;
  int num_data;
  double confidence_level;
  vector<const_char_*,_std::allocator<const_char_*>_> statistics_file;
  double num_data_1;
  StatisticsAccumulation accumulation;
  vector<double,_std::allocator<double>_> tmp_1;
  vector<double,_std::allocator<double>_> first;
  ifstream ifs;
  ostringstream error_message_8;
  vector<double,_std::allocator<double>_> data;
  int tmp;
  Buffer buffer;
  int local_73c;
  OutputFormats local_738;
  int local_734;
  string local_730;
  double local_710;
  double local_708;
  undefined8 local_700;
  char **local_6f8;
  iterator iStack_6f0;
  char **local_6e8;
  string *local_6e0;
  char **local_6d8;
  char **local_6d0;
  double local_6c8;
  StatisticsAccumulation local_6c0;
  vector<double,_std::allocator<double>_> local_6a8;
  vector<double,_std::allocator<double>_> local_690;
  string local_678;
  byte abStack_658 [80];
  ios_base local_608 [408];
  string local_470;
  byte abStack_450 [80];
  ios_base local_400 [408];
  SymmetricMatrix local_268;
  string local_228 [3];
  ios_base local_1b8 [264];
  Buffer local_b0;
  
  local_73c = 1;
  local_734 = -1;
  local_710 = 95.0;
  local_6f8 = (char **)0x0;
  iStack_6f0._M_current = (char **)0x0;
  local_6e8 = (char **)0x0;
  local_700 = 0;
  local_738 = kMeanAndCovariance;
  bVar2 = false;
switchD_001038c2_caseD_65:
  bVar4 = bVar2;
  iVar5 = ya_getopt_long(argc,argv,"l:m:t:c:o:s:deh",(option *)0x0,(int *)0x0);
  bVar2 = true;
  switch(iVar5) {
  case 99:
    std::__cxx11::string::string((string *)&local_678,ya_optarg,(allocator *)&local_470);
    bVar2 = sptk::ConvertStringToDouble(&local_678,&local_710);
    if (!bVar2 || local_710 <= 0.0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678._M_dataplus._M_p != &local_678.field_2) {
        operator_delete(local_678._M_dataplus._M_p);
      }
    }
    else {
      dVar11 = local_710;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678._M_dataplus._M_p != &local_678.field_2) {
        local_708 = local_710;
        operator_delete(local_678._M_dataplus._M_p);
        dVar11 = local_708;
      }
      bVar2 = bVar4;
      if (dVar11 < 100.0) goto switchD_001038c2_caseD_65;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_678,"The argument for the -c option must be a number ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_678,"in the open interval (0, 100)",0x1d);
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
    sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
    break;
  case 100:
    local_700 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
    bVar2 = bVar4;
  case 0x65:
    goto switchD_001038c2_caseD_65;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x72:
    goto switchD_001038c2_caseD_66;
  case 0x68:
    iVar5 = 0;
    anon_unknown.dwarf_393d::PrintUsage((ostream *)&std::cout);
    goto LAB_00103f02;
  case 0x6c:
    std::__cxx11::string::string((string *)&local_678,ya_optarg,(allocator *)&local_470);
    bVar1 = sptk::ConvertStringToInteger(&local_678,&local_73c);
    bVar10 = 0 < local_73c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p);
    }
    bVar2 = bVar4;
    if (bVar1 && bVar10) goto switchD_001038c2_caseD_65;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_678,"The argument for the -l option must be a positive integer",
               0x39);
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
    sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
    break;
  case 0x6d:
    std::__cxx11::string::string((string *)&local_678,ya_optarg,(allocator *)&local_470);
    bVar2 = sptk::ConvertStringToInteger(&local_678,&local_73c);
    bVar10 = -1 < local_73c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p);
    }
    if (bVar2 && bVar10) {
      local_73c = local_73c + 1;
      bVar2 = bVar4;
      goto switchD_001038c2_caseD_65;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_678,"The argument for the -m option must be a ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_678,"non-negative integer",0x14);
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
    sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
    break;
  case 0x6f:
    std::__cxx11::string::string((string *)&local_678,ya_optarg,(allocator *)&local_470);
    bVar2 = sptk::ConvertStringToInteger(&local_678,(int *)local_228);
    if (bVar2) {
      bVar2 = sptk::IsInRange((OutputFormats)local_228[0]._M_dataplus._M_p,0,7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678._M_dataplus._M_p != &local_678.field_2) {
        operator_delete(local_678._M_dataplus._M_p);
      }
      if (bVar2) {
        local_738 = (OutputFormats)local_228[0]._M_dataplus._M_p;
        bVar2 = bVar4;
        goto switchD_001038c2_caseD_65;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_678,"The argument for the -o option must be an integer ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_678,"in the range of ",0x10);
    this = (ostream *)std::ostream::operator<<((ostream *)&local_678,0);
    std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
    std::ostream::operator<<((ostream *)this,7);
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
    sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
    break;
  case 0x73:
    if (iStack_6f0._M_current == local_6e8) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_6f8,iStack_6f0,&ya_optarg
                );
      bVar2 = bVar4;
    }
    else {
      *iStack_6f0._M_current = ya_optarg;
      iStack_6f0._M_current = iStack_6f0._M_current + 1;
      bVar2 = bVar4;
    }
    goto switchD_001038c2_caseD_65;
  case 0x74:
    goto switchD_001038c2_caseD_74;
  default:
    if (iVar5 != -1) goto switchD_001038c2_caseD_66;
    if ((local_734 == -1) || (local_6f8 == iStack_6f0._M_current)) {
      if (argc - ya_optind < 2) {
        if (argc == ya_optind) {
          pcVar9 = (char *)0x0;
        }
        else {
          pcVar9 = argv[ya_optind];
        }
        bVar2 = sptk::SetBinaryMode();
        if (bVar2) {
          local_6e0 = &local_678;
          std::ifstream::ifstream(local_6e0);
          if ((pcVar9 != (char *)0x0) &&
             (std::ifstream::open((char *)&local_678,(_Ios_Openmode)pcVar9),
             (abStack_658[*(long *)(local_678._M_dataplus._M_p + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_470,"Cannot open file ",0x11);
            sVar6 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,pcVar9,sVar6);
            local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"vstat","");
            sptk::PrintErrorMessage(local_228,(ostringstream *)&local_470);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
              operator_delete(local_228[0]._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_470);
            std::ios_base::~ios_base(local_400);
            iVar5 = 1;
            goto LAB_00104ab3;
          }
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            local_6e0 = (string *)&std::cin;
          }
          uVar8 = 0;
          if (local_738 < kNumOutputFormats) {
            if ((0x85U >> (local_738 & 0x1f) & 1) == 0) {
              if ((0x48U >> (local_738 & 0x1f) & 1) != 0) {
                uVar8 = 1;
              }
            }
            else {
              uVar8 = (undefined4)local_700;
            }
          }
          sptk::StatisticsAccumulation::StatisticsAccumulation
                    (&local_6c0,local_73c + -1,(local_738 != kMean) + 1,(bool)((byte)uVar8 & 1),
                     bVar4);
          sptk::StatisticsAccumulation::Buffer::Buffer(&local_b0);
          if (local_6c0.is_valid_ != false) {
            local_708 = (double)CONCAT44(local_708._4_4_,uVar8);
            local_6d8 = iStack_6f0._M_current;
            if (local_6f8 == iStack_6f0._M_current) goto LAB_00104605;
            iVar5 = 0;
            ppcVar7 = local_6f8;
            goto LAB_001041f9;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_470,"Failed to initialize StatisticsAccumulation",0x2b);
          local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"vstat","");
          sptk::PrintErrorMessage(local_228,(ostringstream *)&local_470);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
            operator_delete(local_228[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_470);
          std::ios_base::~ios_base(local_400);
          goto LAB_0010475e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_678,"Cannot set translation mode",0x1b);
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
        sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_678,"Too many input files",0x14);
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
        sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_678,"Cannot specify -t option and -s option at the same time",
                 0x37);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
      sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
    }
  }
LAB_00103ec9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_678);
  std::ios_base::~ios_base(local_608);
  iVar5 = 1;
  goto LAB_00103f02;
LAB_001041f9:
  pcVar9 = *ppcVar7;
  local_6d0 = ppcVar7;
  std::ifstream::ifstream(&local_470);
  std::ifstream::open((char *)&local_470,(_Ios_Openmode)pcVar9);
  if ((abStack_450[*(long *)(local_470._M_dataplus._M_p + -0x18)] & 5) == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_690,(long)local_73c,(allocator_type *)local_228);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_6a8,(long)local_73c,(allocator_type *)local_228);
    sptk::SymmetricMatrix::SymmetricMatrix(&local_268,local_73c);
    do {
      bVar2 = sptk::ReadStream<double>(&local_6c8,(istream *)&local_470);
      if (!bVar2) goto LAB_001045b4;
      bVar4 = sptk::ReadStream<double>
                        (false,0,0,local_73c,&local_690,(istream *)&local_470,(int *)0x0);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Failed to read statistics (first order) in ",0x2b);
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffff8b8 +
                          (int)*(undefined8 *)(local_228[0]._M_dataplus._M_p + -0x18) + 0x520);
        }
        else {
          sVar6 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar9,sVar6);
        }
        local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"vstat","");
        sptk::PrintErrorMessage(&local_730,(ostringstream *)local_228);
        goto LAB_0010457e;
      }
      if (((ulong)local_708 & 1) == 0) {
        bVar4 = sptk::ReadStream(&local_268,(istream *)&local_470);
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Failed to read statistics (second order) in ",0x2c);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffff8b8 +
                            (int)*(undefined8 *)(local_228[0]._M_dataplus._M_p + -0x18) + 0x520);
          }
          else {
            sVar6 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar9,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228," (expected full matrix)",0x17);
          local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"vstat","");
          sptk::PrintErrorMessage(&local_730,(ostringstream *)local_228);
          goto LAB_0010457e;
        }
      }
      else {
        bVar4 = sptk::ReadStream<double>
                          (false,0,0,local_73c,&local_6a8,(istream *)&local_470,(int *)0x0);
        if ((!bVar4) || (bVar4 = sptk::SymmetricMatrix::SetDiagonal(&local_268,&local_6a8), !bVar4))
        {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Failed to read statistics (second order) in ",0x2c);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffff8b8 +
                            (int)*(undefined8 *)(local_228[0]._M_dataplus._M_p + -0x18) + 0x520);
          }
          else {
            sVar6 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar9,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228," (expected diagonal matrix)",0x1b);
          local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"vstat","");
          sptk::PrintErrorMessage(&local_730,(ostringstream *)local_228);
          goto LAB_0010457e;
        }
      }
      bVar4 = sptk::StatisticsAccumulation::Merge
                        (&local_6c0,(int)local_6c8,&local_690,&local_268,&local_b0);
    } while (bVar4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Failed to merge statistics",0x1a);
    local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"vstat_merge","");
    sptk::PrintErrorMessage(&local_730,(ostringstream *)local_228);
LAB_0010457e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730._M_dataplus._M_p != &local_730.field_2) {
      operator_delete(local_730._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    iVar5 = 1;
LAB_001045b4:
    sptk::SymmetricMatrix::~SymmetricMatrix(&local_268);
    if (local_6a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_6a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_690.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_690.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::ifstream::~ifstream(&local_470);
    if (!bVar2) goto code_r0x001045f1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Cannot open file ",0x11);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffff8b8 +
                      (int)*(undefined8 *)(local_228[0]._M_dataplus._M_p + -0x18) + 0x520);
    }
    else {
      sVar6 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar9,sVar6);
    }
    local_268._vptr_SymmetricMatrix = (_func_int **)&local_268.data_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"vstat","");
    sptk::PrintErrorMessage((string *)&local_268,(ostringstream *)local_228);
    if ((vector<double,_std::allocator<double>_> *)local_268._vptr_SymmetricMatrix !=
        &local_268.data_) {
      operator_delete(local_268._vptr_SymmetricMatrix);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    std::ios_base::~ios_base(local_1b8);
    std::ifstream::~ifstream(&local_470);
LAB_0010475e:
    iVar5 = 1;
  }
  goto LAB_00104aa6;
code_r0x001045f1:
  ppcVar7 = local_6d0 + 1;
  if (ppcVar7 == local_6d8) goto LAB_00104605;
  goto LAB_001041f9;
switchD_001038c2_caseD_74:
  std::__cxx11::string::string((string *)&local_678,ya_optarg,(allocator *)&local_470);
  bVar1 = sptk::ConvertStringToInteger(&local_678,&local_734);
  bVar10 = 0 < local_734;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  bVar2 = bVar4;
  if (bVar1 && bVar10) goto switchD_001038c2_caseD_65;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_678);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_678,"The argument for the -t option must be a positive integer",0x39)
  ;
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"vstat","");
  sptk::PrintErrorMessage(&local_470,(ostringstream *)&local_678);
  goto LAB_00103ec9;
switchD_001038c2_caseD_66:
  iVar5 = 1;
  anon_unknown.dwarf_393d::PrintUsage((ostream *)&std::cerr);
  goto LAB_00103f02;
LAB_00104605:
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_268,(long)local_73c,
             (allocator_type *)&local_470);
  iVar5 = 1;
  bVar2 = (bool)((byte)local_700 & 1);
  while (bVar4 = sptk::ReadStream<double>
                           (false,0,0,local_73c,
                            (vector<double,_std::allocator<double>_> *)&local_268,
                            (istream *)local_6e0,(int *)0x0), bVar4) {
    bVar4 = sptk::StatisticsAccumulation::Run
                      (&local_6c0,(vector<double,_std::allocator<double>_> *)&local_268,&local_b0);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_470,"Failed to accumulate statistics",0x1f);
      local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"vstat","");
      sptk::PrintErrorMessage(local_228,(ostringstream *)&local_470);
      goto LAB_00104a5b;
    }
    if ((local_734 != -1) && (iVar5 % local_734 == 0)) {
      bVar4 = anon_unknown.dwarf_393d::OutputStatistics
                        (&local_6c0,&local_b0,local_73c,local_738,local_710,bVar2);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_470,"Failed to write statistics",0x1a);
        local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"vstat","");
        sptk::PrintErrorMessage(local_228,(ostringstream *)&local_470);
        goto LAB_00104a5b;
      }
      sptk::StatisticsAccumulation::Clear(&local_6c0,&local_b0);
    }
    iVar5 = iVar5 + 1;
  }
  bVar4 = sptk::StatisticsAccumulation::GetNumData(&local_6c0,&local_b0,(int *)&local_730);
  if (bVar4) {
    iVar5 = 0;
    if (((local_734 == -1) && (0 < (int)local_730._M_dataplus._M_p)) &&
       (bVar2 = anon_unknown.dwarf_393d::OutputStatistics
                          (&local_6c0,&local_b0,local_73c,local_738,local_710,bVar2), !bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_470,"Failed to write statistics",0x1a);
      local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"vstat","");
      sptk::PrintErrorMessage(local_228,(ostringstream *)&local_470);
      goto LAB_00104a5b;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_470,"Failed to accumulate statistics",0x1f);
    local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"vstat","");
    sptk::PrintErrorMessage(local_228,(ostringstream *)&local_470);
LAB_00104a5b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
      operator_delete(local_228[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_470);
    std::ios_base::~ios_base(local_400);
    iVar5 = 1;
  }
  if ((vector<double,_std::allocator<double>_> *)local_268._vptr_SymmetricMatrix !=
      (vector<double,_std::allocator<double>_> *)0x0) {
    operator_delete(local_268._vptr_SymmetricMatrix);
  }
LAB_00104aa6:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&local_b0);
LAB_00104ab3:
  std::ifstream::~ifstream(&local_678);
LAB_00103f02:
  if (local_6f8 != (char **)0x0) {
    operator_delete(local_6f8);
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  double confidence_level(kDefaultConfidenceLevel);
  OutputFormats output_format(kDefaultOutputFormat);
  std::vector<const char*> statistics_file;
  bool outputs_only_diagonal_elements(kDefaultOutputOnlyDiagonalElementsFlag);
  bool numerically_stable(kDefaultNumericallyStableFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:t:c:o:s:deh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToDouble(optarg, &confidence_level) ||
            confidence_level <= 0.0 || 100.0 <= confidence_level) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a number "
                        << "in the open interval (0, 100)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 's': {
        statistics_file.push_back(optarg);
        break;
      }
      case 'd': {
        outputs_only_diagonal_elements = true;
        break;
      }
      case 'e': {
        numerically_stable = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (kMagicNumberForEndOfFile != output_interval && !statistics_file.empty()) {
    std::ostringstream error_message;
    error_message << "Cannot specify -t option and -s option at the same time";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  bool diagonal(false);
  if (kMeanAndCovariance == output_format || kCovariance == output_format ||
      kSufficientStatistics == output_format) {
    if (outputs_only_diagonal_elements) {
      diagonal = true;
    }
  } else if (kStandardDeviation == output_format ||
             kMeanAndLowerAndUpperBounds == output_format) {
    diagonal = true;
  }

  sptk::StatisticsAccumulation accumulation(vector_length - 1,
                                            kMean == output_format ? 1 : 2,
                                            diagonal, numerically_stable);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  for (const char* file : statistics_file) {
    std::ifstream ifs2;
    ifs2.open(file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    double num_data;
    std::vector<double> first(vector_length);
    std::vector<double> tmp(vector_length);
    sptk::SymmetricMatrix second(vector_length);
    while (sptk::ReadStream(&num_data, &ifs2)) {
      if (!sptk::ReadStream(false, 0, 0, vector_length, &first, &ifs2, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to read statistics (first order) in " << file;
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }

      if (diagonal) {
        if (!sptk::ReadStream(false, 0, 0, vector_length, &tmp, &ifs2, NULL) ||
            !second.SetDiagonal(tmp)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected diagonal matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      } else {
        if (!sptk::ReadStream(&second, &ifs2)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected full matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      }

      if (!accumulation.Merge(static_cast<int>(num_data), first, second,
                              &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to merge statistics";
        sptk::PrintErrorMessage("vstat_merge", error_message);
        return 1;
      }
    }
  }

  std::vector<double> data(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                            confidence_level, outputs_only_diagonal_elements)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }
      accumulation.Clear(&buffer);
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                          confidence_level, outputs_only_diagonal_elements)) {
      std::ostringstream error_message;
      error_message << "Failed to write statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }

  return 0;
}